

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int __thiscall MPLSParser::pgIndexToFullIndex(MPLSParser *this,int value)

{
  size_type sVar1;
  const_reference pvVar2;
  bool bVar3;
  ulong local_28;
  size_t i;
  int cnt;
  int value_local;
  MPLSParser *this_local;
  
  i._0_4_ = 0;
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::size(&this->m_streamInfo);
    if (sVar1 <= local_28) {
      return -1;
    }
    pvVar2 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator[]
                       (&this->m_streamInfo,local_28);
    if (((pvVar2->super_M2TSStreamInfo).stream_coding_type == SUB_PGS) &&
       (bVar3 = (int)i == value, i._0_4_ = (int)i + 1, bVar3)) break;
    local_28 = local_28 + 1;
  }
  return (int)local_28;
}

Assistant:

int MPLSParser::pgIndexToFullIndex(const int value) const
{
    int cnt = 0;
    for (size_t i = 0; i < m_streamInfo.size(); ++i)
    {
        if (m_streamInfo[i].stream_coding_type == StreamType::SUB_PGS)
        {
            if (cnt++ == value)
                return static_cast<int>(i);
        }
    }
    return -1;
}